

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

void __thiscall
TTD::EventLog::RecordJsRTGetAndClearException
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper)

{
  EventLogEntry *pEVar1;
  JsRTResultOnlyAction *local_18;
  JsRTResultOnlyAction *gcAction;
  
  local_18 = (JsRTResultOnlyAction *)0x0;
  pEVar1 = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTResultOnlyAction,(TTD::NSLogEvents::EventKind)43>
                     (this,&local_18);
  if (actionPopper->m_actionEvent == (EventLogEntry *)0x0) {
    actionPopper->m_actionEvent = pEVar1;
    actionPopper->m_resultPtr = &local_18->Result;
    local_18->Result = (TTDVar)0x0;
    return;
  }
  TTDAbort_unrecoverable_error("Don\'t double initialize");
}

Assistant:

void EventLog::RecordJsRTGetAndClearException(TTDJsRTActionResultAutoRecorder& actionPopper)
    {
        NSLogEvents::JsRTResultOnlyAction* gcAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTResultOnlyAction, NSLogEvents::EventKind::GetAndClearExceptionActionTag>(&gcAction);

        actionPopper.InitializeWithEventAndEnterWResult(evt, &(gcAction->Result));
    }